

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapRead.c
# Opt level: O1

Vec_Ptr_t * Amap_DeriveTokens(char *pBuffer)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  void **ppvVar4;
  char *pcVar5;
  char *__s1;
  uint uVar6;
  long lVar7;
  
  pVVar3 = (Vec_Ptr_t *)malloc(0x10);
  pVVar3->nCap = 1000;
  pVVar3->nSize = 0;
  ppvVar4 = (void **)malloc(8000);
  pVVar3->pArray = ppvVar4;
  pcVar5 = strtok(pBuffer," =\t\r\n");
  if (pcVar5 != (char *)0x0) {
    lVar7 = (long)pVVar3->nSize;
    uVar6 = pVVar3->nCap;
    ppvVar4 = pVVar3->pArray;
    do {
      if (uVar6 == (uint)lVar7) {
        if ((int)uVar6 < 0x10) {
          if (ppvVar4 == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(ppvVar4,0x80);
          }
          uVar6 = 0x10;
        }
        else {
          uVar1 = uVar6 * 2;
          if (SBORROW4(uVar6,uVar1) != 0 < (int)uVar6) {
            uVar6 = uVar1;
            if (ppvVar4 == (void **)0x0) {
              ppvVar4 = (void **)malloc((ulong)uVar1 << 3);
            }
            else {
              ppvVar4 = (void **)realloc(ppvVar4,(ulong)uVar1 << 3);
            }
          }
        }
      }
      ppvVar4[lVar7] = pcVar5;
      __s1 = strtok((char *)0x0," =\t\r\n");
      pcVar5 = (char *)0x0;
      if ((__s1 != (char *)0x0) && (iVar2 = strcmp(__s1,"LATCH"), pcVar5 = __s1, iVar2 == 0)) {
        do {
          iVar2 = strcmp(__s1,"GATE");
          pcVar5 = __s1;
          if (iVar2 == 0) break;
          __s1 = strtok((char *)0x0," =\t\r\n");
          pcVar5 = (char *)0x0;
        } while (__s1 != (char *)0x0);
      }
      lVar7 = lVar7 + 1;
    } while (pcVar5 != (char *)0x0);
    pVVar3->nSize = (int)lVar7;
    pVVar3->nCap = uVar6;
    pVVar3->pArray = ppvVar4;
  }
  return pVVar3;
}

Assistant:

Vec_Ptr_t * Amap_DeriveTokens( char * pBuffer )
{
    Vec_Ptr_t * vTokens;
    char * pToken;
    vTokens = Vec_PtrAlloc( 1000 );
    pToken = strtok( pBuffer, " =\t\r\n" );
    while ( pToken )
    {
        Vec_PtrPush( vTokens, pToken );
        pToken = strtok( NULL, " =\t\r\n" );
        // skip latches
        if ( pToken && strcmp( pToken, "LATCH" ) == 0 )
            while ( pToken && strcmp( pToken, "GATE" ) != 0 )
                pToken = strtok( NULL, " =\t\r\n" );
    }
    return vTokens;
}